

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O2

wchar_t lzx_make_huffman_table(huffman *hf)

{
  uint16_t *puVar1;
  uchar *puVar2;
  uint uVar3;
  ulong uVar4;
  byte bVar5;
  wchar_t wVar6;
  long lVar7;
  wchar_t wVar8;
  ulong uVar9;
  wchar_t wVar10;
  ulong uVar11;
  wchar_t awStack_a4 [9];
  wchar_t bitptn [17];
  uint uStack_14;
  
  wVar6 = L'\0';
  uVar3 = 0x8000;
  wVar10 = L'\0';
  for (lVar7 = -0x10; lVar7 != 0; lVar7 = lVar7 + 1) {
    bitptn[lVar7 + 7] = wVar6;
    (&uStack_14)[lVar7] = uVar3;
    wVar6 = wVar6 + hf->freq[lVar7 + 0x11] * uVar3;
    if (hf->freq[lVar7 + 0x11] != L'\0') {
      wVar10 = (int)lVar7 + L'\x11';
    }
    uVar3 = uVar3 >> 1;
  }
  wVar8 = L'\0';
  if (((short)wVar6 == 0) && (wVar6 = hf->tbl_bits, wVar10 <= wVar6)) {
    hf->max_bits = wVar10;
    if (wVar10 < L'\x10') {
      bVar5 = 0x10 - (char)wVar10;
      uVar4 = 0;
      uVar9 = (ulong)(uint)wVar10;
      if (wVar10 < L'\x01') {
        uVar9 = uVar4;
      }
      for (; uVar9 != uVar4; uVar4 = uVar4 + 1) {
        awStack_a4[uVar4] = awStack_a4[uVar4] >> (bVar5 & 0x1f);
        bitptn[uVar4 + 0xb] = bitptn[uVar4 + 0xb] >> (bVar5 & 0x1f);
      }
    }
    wVar10 = 1 << ((byte)wVar6 & 0x1f);
    puVar1 = hf->tbl;
    puVar2 = hf->bitlen;
    hf->tree_used = L'\0';
    uVar4 = 0;
    uVar9 = (ulong)(uint)hf->len_size;
    if (hf->len_size < L'\x01') {
      uVar9 = uVar4;
    }
    for (; uVar4 != uVar9; uVar4 = uVar4 + 1) {
      bVar5 = puVar2[uVar4];
      if (bVar5 != 0) {
        if (wVar10 < (int)(uint)bVar5) {
          return L'\0';
        }
        wVar6 = awStack_a4[(ulong)bVar5 - 1];
        uVar11 = (ulong)(uint)bitptn[(ulong)bVar5 + 10];
        wVar8 = bitptn[(ulong)bVar5 + 10] + wVar6;
        awStack_a4[(ulong)bVar5 - 1] = wVar8;
        if (wVar10 < wVar8) {
          return L'\0';
        }
        for (; 0 < (int)uVar11; uVar11 = uVar11 - 1) {
          puVar1[(long)wVar6 + (uVar11 - 1)] = (uint16_t)uVar4;
        }
      }
    }
    wVar8 = L'\x01';
  }
  return wVar8;
}

Assistant:

static int
lzx_make_huffman_table(struct huffman *hf)
{
	uint16_t *tbl;
	const unsigned char *bitlen;
	int bitptn[17], weight[17];
	int i, maxbits = 0, ptn, tbl_size, w;
	int len_avail;

	/*
	 * Initialize bit patterns.
	 */
	ptn = 0;
	for (i = 1, w = 1 << 15; i <= 16; i++, w >>= 1) {
		bitptn[i] = ptn;
		weight[i] = w;
		if (hf->freq[i]) {
			ptn += hf->freq[i] * w;
			maxbits = i;
		}
	}
	if ((ptn & 0xffff) != 0 || maxbits > hf->tbl_bits)
		return (0);/* Invalid */

	hf->max_bits = maxbits;

	/*
	 * Cut out extra bits which we won't house in the table.
	 * This preparation reduces the same calculation in the for-loop
	 * making the table.
	 */
	if (maxbits < 16) {
		int ebits = 16 - maxbits;
		for (i = 1; i <= maxbits; i++) {
			bitptn[i] >>= ebits;
			weight[i] >>= ebits;
		}
	}

	/*
	 * Make the table.
	 */
	tbl_size = 1 << hf->tbl_bits;
	tbl = hf->tbl;
	bitlen = hf->bitlen;
	len_avail = hf->len_size;
	hf->tree_used = 0;
	for (i = 0; i < len_avail; i++) {
		uint16_t *p;
		int len, cnt;

		if (bitlen[i] == 0)
			continue;
		/* Get a bit pattern */
		len = bitlen[i];
		if (len > tbl_size)
			return (0);
		ptn = bitptn[len];
		cnt = weight[len];
		/* Calculate next bit pattern */
		if ((bitptn[len] = ptn + cnt) > tbl_size)
			return (0);/* Invalid */
		/* Update the table */
		p = &(tbl[ptn]);
		while (--cnt >= 0)
			p[cnt] = (uint16_t)i;
	}
	return (1);
}